

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base642midi.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  ostream *poVar2;
  size_t in_RCX;
  void *__buf;
  undefined1 local_230 [8];
  MidiFile midifile;
  string local_1b8;
  undefined1 local_198 [8];
  string filename;
  allocator local_151;
  string local_150;
  allocator local_129;
  string local_128;
  undefined1 local_f8 [8];
  Options opts;
  char **argv_local;
  int argc_local;
  
  opts.m_extraArgv_strings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)argv;
  smf::Options::Options((Options *)local_f8);
  smf::Options::setOptions
            ((Options *)local_f8,argc,
             (char **)opts.m_extraArgv_strings.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_128,"o|output=s:test.mid",&local_129);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_150,"Output filename",&local_151);
  smf::Options::define((Options *)local_f8,&local_128,&local_150);
  std::__cxx11::string::~string((string *)&local_150);
  std::allocator<char>::~allocator((allocator<char> *)&local_151);
  std::__cxx11::string::~string((string *)&local_128);
  std::allocator<char>::~allocator((allocator<char> *)&local_129);
  smf::Options::process((Options *)local_f8,1,0);
  iVar1 = smf::Options::getArgCount((Options *)local_f8);
  if (iVar1 != 0) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"Usage: cat base64.txt | ");
    smf::Options::getCommand_abi_cxx11_((string *)((long)&filename.field_2 + 8),(Options *)local_f8)
    ;
    poVar2 = std::operator<<(poVar2,(string *)(filename.field_2._M_local_buf + 8));
    poVar2 = std::operator<<(poVar2," -o output.mid ");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)(filename.field_2._M_local_buf + 8));
    exit(1);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1b8,"output",(allocator *)&midifile.field_0x6f);
  smf::Options::getString((string *)local_198,(Options *)local_f8,&local_1b8);
  std::__cxx11::string::~string((string *)&local_1b8);
  std::allocator<char>::~allocator((allocator<char> *)&midifile.field_0x6f);
  smf::MidiFile::MidiFile((MidiFile *)local_230);
  smf::MidiFile::readBase64((MidiFile *)local_230,(istream *)&std::cin);
  smf::MidiFile::write((MidiFile *)local_230,(int)local_198,__buf,in_RCX);
  smf::MidiFile::~MidiFile((MidiFile *)local_230);
  std::__cxx11::string::~string((string *)local_198);
  smf::Options::~Options((Options *)local_f8);
  return 0;
}

Assistant:

int main(int argc, char** argv) {
	Options opts;
	opts.setOptions(argc, argv);
	opts.define("o|output=s:test.mid", "Output filename");
	opts.process();
	if (opts.getArgCount() != 0) {
		cerr << "Usage: cat base64.txt | " << opts.getCommand() << " -o output.mid " << endl;
		exit(1);
	}

	string filename = opts.getString("output");

	MidiFile midifile;
	midifile.readBase64(cin);
	midifile.write(filename);
	return 0;
}